

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

void test_recv_impl(char *file,int line,int sock,char *data)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  size_t __n;
  void *__s2;
  uint *puVar3;
  char *pcVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  
  uVar5 = (ulong)file & 0xffffffff;
  __n = strlen((char *)CONCAT44(in_register_00000014,sock));
  __s2 = malloc(__n + 1);
  if (__s2 == (void *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/testutil.h"
            ,0xa2);
    fflush(_stderr);
    nn_err_abort();
  }
  uVar1 = nn_recv(line,__s2,__n + 1,0);
  __stream = _stderr;
  if ((int)uVar1 < 0) {
    puVar3 = (uint *)__errno_location();
    pcVar4 = nn_err_strerror(*puVar3);
    fprintf(__stream,"Failed to recv: %s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar3,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/pipeline.c"
            ,uVar5);
    nn_err_abort();
  }
  if (uVar1 != (uint)__n) {
    fprintf(_stderr,"Received data has wrong length: %d != %d (%s:%d)\n",(ulong)uVar1,
            __n & 0xffffffff,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/pipeline.c"
            ,uVar5);
    nn_err_abort();
  }
  iVar2 = bcmp((char *)CONCAT44(in_register_00000014,sock),__s2,__n);
  if (iVar2 == 0) {
    free(__s2);
    return;
  }
  fprintf(_stderr,"Received data is wrong (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/pipeline.c"
          ,uVar5);
  nn_err_abort();
}

Assistant:

static void NN_UNUSED test_recv_impl (char *file, int line, int sock, char *data)
{
    size_t data_len;
    int rc;
    char *buf;

    data_len = strlen (data);
    /*  We allocate plus one byte so that we are sure that message received
        has correct length and not truncated  */
    buf = malloc (data_len+1);
    alloc_assert (buf);

    rc = nn_recv (sock, buf, data_len+1, 0);
    if (rc < 0) {
        fprintf (stderr, "Failed to recv: %s [%d] (%s:%d)\n",
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    if (rc != (int)data_len) {
        fprintf (stderr, "Received data has wrong length: %d != %d (%s:%d)\n",
            rc, (int) data_len,
            file, line);
        nn_err_abort ();
    }
    if (memcmp (data, buf, data_len) != 0) {
        /*  We don't print the data as it may have binary garbage  */
        fprintf (stderr, "Received data is wrong (%s:%d)\n", file, line);
        nn_err_abort ();
    }

    free (buf);
}